

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_swapNotEmptyWithEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
::TestBody(optTyped_swapNotEmptyWithEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
           *this)

{
  value_type *value;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  value_type *default_value;
  storage_type local_71;
  AssertHelper local_70;
  opt_type o1;
  AssertionResult gtest_ar__2;
  AssertHelper local_50;
  AssertionResult gtest_ar_;
  
  value = &(this->
           super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
           ).value_1;
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  opt<const_(anonymous_namespace)::weekday_&,_true,_true>(&o1,value);
  local_71 = o1.storage_;
  o1.storage_ = (storage_type)(weekday)0x7;
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::value(&o1);
  }
  testing::Message::Message((Message *)&gtest_ar_);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x334,
             "Expected: o1.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
  default_value =
       &(this->
        super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
        ).value_2;
  gtest_ar__2.success_ =
       (bool)mp::
             opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>
             ::value_or<(anonymous_namespace)::weekday_const&>
                       ((opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>
                         *)&o1,default_value);
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)&gtest_ar_,"this->value_2","o1.value_or(this->value_2)",
             default_value,(weekday *)&gtest_ar__2);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x335,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__2.success_ = local_71.null_value != '\a';
  if (!gtest_ar__2.success_) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)0x1896ab,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x336,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  gtest_ar__2.success_ = local_71.null_value != '\a';
  if (!gtest_ar__2.success_) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)"o2.has_value()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x337,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  operator*((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
             *)&local_71.value);
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)&gtest_ar_,"this->value_1","*o2",value,&local_71.value);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x338,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  value((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
         *)&local_71.value);
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)&gtest_ar_,"this->value_1","o2.value()",value,&local_71.value);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x339,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__2.success_ =
       (bool)mp::
             opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>
             ::value_or<(anonymous_namespace)::weekday_const&>
                       ((opt<(anonymous_namespace)::weekday,mp::opt_default_policy<(anonymous_namespace)::weekday>>
                         *)&local_71.value,default_value);
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)&gtest_ar_,"this->value_1","o2.value_or(this->value_2)",value,
             (weekday *)&gtest_ar__2);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x33a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TYPED_TEST(optTyped, swapNotEmptyWithEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1{this->value_1};
  opt_type o2;
  std::swap(o1, o2);
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->value_2));
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}